

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StickyAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::StickyAtomTypesSectionParser::parseLine
          (StickyAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  AtomType *pAVar3;
  RealType RVar4;
  string atomTypeName;
  StickyAdapter sa;
  StringTokenizer tokenizer;
  string local_e8;
  double local_c8;
  RealType local_c0;
  RealType local_b8;
  RealType local_b0;
  RealType local_a8;
  RealType local_a0;
  double local_98;
  double local_90;
  StickyAdapter local_88;
  StringTokenizer local_80;
  
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_80,line,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  iVar2 = StringTokenizer::countTokens(&local_80);
  if (iVar2 < 8) {
    snprintf(painCave.errMsg,2000,
             "StickyAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    local_98 = (this->options_->EnergyUnitScaling).data_;
    local_90 = (this->options_->DistanceUnitScaling).data_;
    StringTokenizer::nextToken_abi_cxx11_(&local_e8,&local_80);
    pAVar3 = ForceField::getAtomType(ff,&local_e8);
    if (pAVar3 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "StickyAtomTypesSectionParser Error: Can not find matching AtomType %s\n",
               local_e8._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_88.at_ = pAVar3;
      local_a0 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_b0 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_b8 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_c0 = StringTokenizer::nextTokenAsDouble(&local_80);
      local_c8 = StringTokenizer::nextTokenAsDouble(&local_80);
      RVar4 = StringTokenizer::nextTokenAsDouble(&local_80);
      StickyAdapter::makeSticky
                (&local_88,local_a0,local_a8 * local_98,local_b0 * local_98,local_b8 * local_90,
                 local_c0 * local_90,local_c8 * local_90,RVar4 * local_90,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.delim_._M_dataplus._M_p != &local_80.delim_.field_2) {
    operator_delete(local_80.delim_._M_dataplus._M_p,
                    local_80.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tokenString_._M_dataplus._M_p != &local_80.tokenString_.field_2) {
    operator_delete(local_80.tokenString_._M_dataplus._M_p,
                    local_80.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void StickyAtomTypesSectionParser::parseLine(ForceField& ff,
                                               const string& line, int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens  = tokenizer.countTokens();
    RealType dus = options_.getDistanceUnitScaling();
    RealType eus = options_.getEnergyUnitScaling();

    // in AtomTypeSection, a line at least contains 8 tokens
    // atomTypeName and 7 different sticky parameters
    if (nTokens < 8) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StickyAtomTypesSectionParser Error: Not enough "
               "tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      string atomTypeName = tokenizer.nextToken();
      AtomType* atomType  = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        StickyAdapter sa = StickyAdapter(atomType);

        RealType w0  = tokenizer.nextTokenAsDouble();
        RealType v0  = eus * tokenizer.nextTokenAsDouble();
        RealType v0p = eus * tokenizer.nextTokenAsDouble();
        RealType rl  = dus * tokenizer.nextTokenAsDouble();
        RealType ru  = dus * tokenizer.nextTokenAsDouble();
        RealType rlp = dus * tokenizer.nextTokenAsDouble();
        RealType rup = dus * tokenizer.nextTokenAsDouble();
        bool isPower = false;

        sa.makeSticky(w0, v0, v0p, rl, ru, rlp, rup, isPower);

      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "StickyAtomTypesSectionParser Error: "
                 "Can not find matching AtomType %s\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }